

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void duckdb::StringValueResult::AddValue(StringValueResult *result,idx_t buffer_pos)

{
  LinePosition *error_position;
  ulong uVar1;
  ulong uVar2;
  InternalException *this;
  long lVar3;
  idx_t iVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  string local_50;
  
  uVar1 = (result->super_ScannerResult).last_position.buffer_pos;
  if (uVar1 <= buffer_pos) {
    error_position = &(result->super_ScannerResult).last_position;
    if ((result->super_ScannerResult).quoted == true) {
      uVar1 = result->extra_delimiter_bytes;
      uVar6 = buffer_pos - uVar1;
      if ((result->super_ScannerResult).unquoted == false) {
        local_50._M_dataplus._M_p._0_1_ = 4;
        LineError::Insert(&result->current_errors,(CSVErrorType *)&local_50,&result->cur_col_id,
                          &result->chunk_col_id,error_position,0);
      }
      uVar2 = (result->super_ScannerResult).quoted_position;
      lVar3 = ~uVar2 + uVar6;
      if (lVar3 == 0) {
        pcVar5 = result->buffer_ptr;
        iVar4 = 0xffffffffffffffff;
      }
      else {
        pcVar5 = result->buffer_ptr;
        if (result->ignore_empty_values == true) {
          pcVar7 = pcVar5 + buffer_pos + ~uVar1;
          do {
            if (*pcVar7 != ' ') goto LAB_017e9bf6;
            pcVar7 = pcVar7 + -1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          lVar3 = 0;
        }
LAB_017e9bf6:
        iVar4 = lVar3 - 1;
      }
      AddPossiblyEscapedValue
                (result,uVar6,pcVar5 + uVar2 + 1,iVar4,
                 uVar6 < (result->super_ScannerResult).last_position.buffer_pos + 2);
      (result->super_ScannerResult).quoted = false;
    }
    else if ((result->super_ScannerResult).escaped == true) {
      AddPossiblyEscapedValue(result,buffer_pos,result->buffer_ptr + uVar1,buffer_pos - uVar1,false)
      ;
    }
    else {
      uVar6 = result->extra_delimiter_bytes + uVar1;
      iVar4 = buffer_pos - uVar6;
      if (buffer_pos < uVar6) {
        if (buffer_pos != uVar1) {
          this = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Value size is lower than the number of extra delimiter bytes in the HandleMultiDelimiter(). buffer_pos = %d, last_position.buffer_pos = %d, extra_delimiter_bytes = %d"
                     ,"");
          InternalException::InternalException<unsigned_long,unsigned_long,unsigned_long>
                    (this,&local_50,buffer_pos,
                     (result->super_ScannerResult).last_position.buffer_pos,
                     result->extra_delimiter_bytes);
          __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar4 = 0;
      }
      AddValueToVector(result,result->buffer_ptr + uVar1,iVar4,false);
    }
    error_position->buffer_pos = buffer_pos + 1;
  }
  return;
}

Assistant:

void StringValueResult::AddValue(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos > buffer_pos) {
		return;
	}
	if (result.quoted) {
		AddQuotedValue(result, buffer_pos - result.extra_delimiter_bytes);
	} else if (result.escaped) {
		AddPossiblyEscapedValue(result, buffer_pos, result.buffer_ptr + result.last_position.buffer_pos,
		                        buffer_pos - result.last_position.buffer_pos, false);
	} else {
		result.AddValueToVector(result.buffer_ptr + result.last_position.buffer_pos,
		                        result.HandleMultiDelimiter(buffer_pos));
	}
	result.last_position.buffer_pos = buffer_pos + 1;
}